

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O2

vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> * __thiscall
libcalc::Tokenizer::toRPN
          (vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *__return_storage_ptr__,
          Tokenizer *this)

{
  pointer ppTVar1;
  bool bVar2;
  char *pcVar3;
  pointer ppTVar4;
  undefined1 local_88 [8];
  stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_> op;
  Token *t;
  
  (__return_storage_ptr__->super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::stack<libcalc::Token*,std::deque<libcalc::Token*,std::allocator<libcalc::Token*>>>::
  stack<std::deque<libcalc::Token*,std::allocator<libcalc::Token*>>,void>
            ((stack<libcalc::Token_*,_std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
              *)local_88);
  ppTVar4 = (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppTVar4 == ppTVar1) {
      while (op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
             super__Deque_impl_data._M_map_size) {
        pcVar3 = (char *)op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node;
        if ((_Elt_pointer)
            op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_node ==
            op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur) {
          pcVar3 = &op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
        }
        std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                  (__return_storage_ptr__,(value_type *)(pcVar3 + -8));
        std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::pop_back
                  ((deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *)local_88);
      }
      std::_Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::~_Deque_base
                ((_Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *)local_88);
      return __return_storage_ptr__;
    }
    op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)*ppTVar4;
    if (((Token *)
        op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node)->type == '\x01') {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              op.c.
                              super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,"+");
      if (bVar2) {
LAB_00103b83:
        while (op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node !=
               (_Map_pointer)
               op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
               super__Deque_impl_data._M_map_size) {
          pcVar3 = (char *)op.c.
                           super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                           _M_impl.super__Deque_impl_data._M_start._M_node;
          if ((_Elt_pointer)
              op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_node ==
              op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur) {
            pcVar3 = &op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
          }
          bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)(pcVar3 + -8),"-");
          if (!bVar2) {
            pcVar3 = (char *)op.c.
                             super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_node;
            if ((_Elt_pointer)
                op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_node ==
                op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur) {
              pcVar3 = &op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
            }
            bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      **)(pcVar3 + -8),"+");
            if (!bVar2) {
              pcVar3 = (char *)op.c.
                               super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node;
              if ((_Elt_pointer)
                  op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node ==
                  op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                pcVar3 = &op.c.
                          super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
              }
              bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        **)(pcVar3 + -8),"*");
              if (!bVar2) {
                pcVar3 = (char *)op.c.
                                 super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node;
                if ((_Elt_pointer)
                    op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node ==
                    op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                  pcVar3 = &op.c.
                            super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
                }
                bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          **)(pcVar3 + -8),"/");
                if (!bVar2) {
                  pcVar3 = (char *)op.c.
                                   super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node;
                  if ((_Elt_pointer)
                      op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node ==
                      op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                    pcVar3 = &op.c.
                              super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
                  }
                  bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            **)(pcVar3 + -8),"%");
                  if (!bVar2) {
                    pcVar3 = (char *)op.c.
                                     super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node;
                    if ((_Elt_pointer)
                        op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node ==
                        op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                      pcVar3 = &op.c.
                                super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
                    }
                    bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              **)(pcVar3 + -8),"!");
                    if (!bVar2) {
                      pcVar3 = (char *)op.c.
                                       super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node;
                      if ((_Elt_pointer)
                          op.c.
                          super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node ==
                          op.c.
                          super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                        pcVar3 = &op.c.
                                  super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
                      }
                      bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                **)(pcVar3 + -8),"^");
                      if (!bVar2) break;
                    }
                  }
                }
              }
            }
          }
          pcVar3 = (char *)op.c.
                           super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                           _M_impl.super__Deque_impl_data._M_start._M_node;
          if ((_Elt_pointer)
              op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_node ==
              op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur) {
            pcVar3 = &op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
          }
          std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                    (__return_storage_ptr__,(value_type *)(pcVar3 + -8));
          std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::pop_back
                    ((deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *)local_88);
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )op.c.
                                 super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node,"-");
        if (bVar2) goto LAB_00103b83;
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )op.c.
                                 super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node,"*");
        if (bVar2) {
LAB_00103d23:
          while (op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl
                 .super__Deque_impl_data._M_start._M_node !=
                 (_Map_pointer)
                 op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl
                 .super__Deque_impl_data._M_map_size) {
            pcVar3 = (char *)op.c.
                             super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_node;
            if ((_Elt_pointer)
                op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_node ==
                op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur) {
              pcVar3 = &op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
            }
            bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      **)(pcVar3 + -8),"*");
            if (!bVar2) {
              pcVar3 = (char *)op.c.
                               super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node;
              if ((_Elt_pointer)
                  op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node ==
                  op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                pcVar3 = &op.c.
                          super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
              }
              bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        **)(pcVar3 + -8),"/");
              if (!bVar2) {
                pcVar3 = (char *)op.c.
                                 super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node;
                if ((_Elt_pointer)
                    op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node ==
                    op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                  pcVar3 = &op.c.
                            super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
                }
                bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          **)(pcVar3 + -8),"%");
                if (!bVar2) {
                  pcVar3 = (char *)op.c.
                                   super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node;
                  if ((_Elt_pointer)
                      op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node ==
                      op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                    pcVar3 = &op.c.
                              super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
                  }
                  bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            **)(pcVar3 + -8),"!");
                  if (!bVar2) {
                    pcVar3 = (char *)op.c.
                                     super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node;
                    if ((_Elt_pointer)
                        op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node ==
                        op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                      pcVar3 = &op.c.
                                super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
                    }
                    bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              **)(pcVar3 + -8),"^");
                    if (!bVar2) break;
                  }
                }
              }
            }
            pcVar3 = (char *)op.c.
                             super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_node;
            if ((_Elt_pointer)
                op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_node ==
                op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur) {
              pcVar3 = &op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
            }
            std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                      (__return_storage_ptr__,(value_type *)(pcVar3 + -8));
            std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::pop_back
                      ((deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *)local_88);
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)op.c.
                                     super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_node,"/");
          if (bVar2) goto LAB_00103d23;
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)op.c.
                                     super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_node,"(");
          if (!bVar2) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)op.c.
                                       super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_node,"^");
            if (!bVar2) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)op.c.
                                         super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node,"%");
              if (!bVar2) {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)op.c.
                                           super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                           ._M_impl.super__Deque_impl_data._M_finish._M_node,"!");
                if (!bVar2) {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)op.c.
                                             super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                             ._M_impl.super__Deque_impl_data._M_finish._M_node,")");
                  if (bVar2) {
                    while (op.c.
                           super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                           _M_impl.super__Deque_impl_data._M_start._M_node !=
                           (_Map_pointer)
                           op.c.
                           super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                           _M_impl.super__Deque_impl_data._M_map_size) {
                      pcVar3 = (char *)op.c.
                                       super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node;
                      if ((_Elt_pointer)
                          op.c.
                          super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node ==
                          op.c.
                          super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                        pcVar3 = &op.c.
                                  super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
                      }
                      bVar2 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                **)(pcVar3 + -8),"(");
                      if (!bVar2) break;
                      pcVar3 = (char *)op.c.
                                       super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node;
                      if ((_Elt_pointer)
                          op.c.
                          super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node ==
                          op.c.
                          super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur) {
                        pcVar3 = &op.c.
                                  super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][0xc].type;
                      }
                      std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                                (__return_storage_ptr__,(value_type *)(pcVar3 + -8));
                      std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::pop_back
                                ((deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *)
                                 local_88);
                    }
                    std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::pop_back
                              ((deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *)
                               local_88);
                  }
                  goto LAB_00103e88;
                }
              }
            }
          }
        }
      }
      std::deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                ((deque<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *)local_88,
                 (value_type *)
                 &op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node);
    }
    else {
      std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                (__return_storage_ptr__,
                 (value_type *)
                 &op.c.super__Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node);
    }
LAB_00103e88:
    ppTVar4 = ppTVar4 + 1;
  } while( true );
}

Assistant:

std::vector<Token *> Tokenizer::toRPN() {
  std::vector<Token *> rpn;
  std::stack<Token *> op;

  for (auto t : tokens) {
    if (t->type != TOKEN_TYPE.OPERATOR) {
      rpn.push_back(t);
      continue;
    } else if (t->value == "+" || t->value == "-") {

        while( !op.empty() &&
            (op.top()->value == "-" ||
             op.top()->value == "+" ||
             op.top()->value == "*" ||
             op.top()->value == "/" ||
             op.top()->value == "%" ||
             op.top()->value == "!" ||
             op.top()->value == "^" )) {

          rpn.push_back(op.top());
          op.pop();
        }

        op.push(t);

    } else if (t->value == "*" || t->value == "/") {

        while( !op.empty() &&
            (op.top()->value == "*" ||
             op.top()->value == "/" ||
             op.top()->value == "%" ||
             op.top()->value == "!" ||
             op.top()->value == "^" )) {

          rpn.push_back(op.top());
          op.pop();
        }
        op.push(t);

    } else if (t->value == "(" ||
               t->value == "^" ||
               t->value == "%" ||
               t->value == "!") {

      op.push(t);

    } else if (t->value == ")") {
      while (!op.empty() && op.top()->value != "(") {
        rpn.push_back(op.top());
        op.pop();
      }
      op.pop();
    }
  }

  while(!op.empty()) {
    rpn.push_back(op.top());
    op.pop();
  }

  return rpn;
}